

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DivideTest.h
# Opt level: O0

void __thiscall
DivideTest<unsigned_long>::test_pow2_numerators<(libdivide::Branching)0>
          (DivideTest<unsigned_long> *this,unsigned_long denom,
          divider<unsigned_long,_(libdivide::Branching)0> *the_divider)

{
  unsigned_long numerator;
  int j;
  int i;
  DivideTest<unsigned_long> *in_stack_00000038;
  undefined4 local_20;
  undefined4 local_1c;
  
  for (local_1c = 1; local_1c < 0x40; local_1c = local_1c + 1) {
    for (local_20 = -1; local_20 < 2; local_20 = local_20 + 1) {
      test_one<(libdivide::Branching)0>(in_stack_00000038,(unsigned_long)this,denom,the_divider);
    }
  }
  return;
}

Assistant:

void test_pow2_numerators(T denom, const divider<T, ALGO> &the_divider) {
        // test power of 2 numerators: 2^i-1, 2^i, 2^i+1
        for (int i = 1; i < limits::digits; i++) {
            for (int j = -1; j <= 1; j++) {
                T numerator = static_cast<T>((static_cast<T>(1) << i) + j);
                test_one(numerator, denom, the_divider);

                if (limits::is_signed) {
                    test_one(-numerator, denom, the_divider);
                }
            }
        }
    }